

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_bounds.h
# Opt level: O0

PreprocessInfoStd * __thiscall
mp::
BoundComputations<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ComputeBoundsAndType<mp::LinTerms>
          (BoundComputations<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,AlgebraicExpression<mp::LinTerms> *ae)

{
  bool bVar1;
  AlgebraicExpression<mp::LinTerms> *in_RDX;
  double in_RSI;
  PreprocessInfoStd *in_RDI;
  double dVar2;
  PreprocessInfoStd *result;
  LinTerms *in_stack_00000028;
  BoundComputations<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000030;
  
  AlgebraicExpression<mp::LinTerms>::GetBody(in_RDX);
  ComputeBoundsAndType(in_stack_00000030,in_stack_00000028);
  dVar2 = AlgebraicExpression<mp::LinTerms>::constant_term(in_RDX);
  in_RDI->lb_ = dVar2 + in_RDI->lb_;
  dVar2 = AlgebraicExpression<mp::LinTerms>::constant_term(in_RDX);
  in_RDI->ub_ = dVar2 + in_RDI->ub_;
  AlgebraicExpression<mp::LinTerms>::constant_term(in_RDX);
  bVar1 = is_integer<double>(in_RSI);
  if (!bVar1) {
    in_RDI->type_ = CONTINUOUS;
  }
  return in_RDI;
}

Assistant:

PreprocessInfoStd ComputeBoundsAndType(
      const AlgebraicExpression<Body>& ae) const {
    PreprocessInfoStd result
        = ComputeBoundsAndType(ae.GetBody());
    result.lb_ += ae.constant_term();
    result.ub_ += ae.constant_term();
    if (!is_integer(ae.constant_term()))
      result.type_ = var::CONTINUOUS;
    return result;
  }